

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

int __thiscall Fl_Input_::copy_cuts(Fl_Input_ *this)

{
  int iVar1;
  Fl_Input_ *this_local;
  
  if ((yankcut != 0) && (iVar1 = input_type(this), iVar1 != 5)) {
    Fl::copy((EVP_PKEY_CTX *)undobuffer,(EVP_PKEY_CTX *)(ulong)(uint)yankcut);
    return 1;
  }
  return 0;
}

Assistant:

int Fl_Input_::copy_cuts() {
  // put the yank buffer into the X clipboard
  if (!yankcut || input_type()==FL_SECRET_INPUT) return 0;
  Fl::copy(undobuffer, yankcut, 1);
  return 1;
}